

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::put_bytes(lzcompressor *this,void *pBuf,uint buf_len)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint num_bytes_to_copy;
  uint num_src_bytes_remaining;
  uint8 *pSrcBuf;
  bool status;
  uint in_stack_00001f8c;
  void *in_stack_00001f90;
  lzcompressor *in_stack_00001f98;
  uchar *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined1 grow_hint;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar6;
  uint local_2c;
  bool local_1d;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x387c) & 1) == 0) {
    local_1d = true;
    local_2c = in_EDX;
    if (in_RSI == 0) {
      uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x3850));
      grow_hint = (undefined1)((uint)in_stack_ffffffffffffffb0 >> 0x18);
      if (uVar2 != 0) {
        vector<unsigned_char>::get_ptr((vector<unsigned_char> *)(in_RDI + 0x3850));
        vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x3850));
        local_1d = compress_block(in_stack_00001f98,in_stack_00001f90,in_stack_00001f8c);
        vector<unsigned_char>::try_resize
                  ((vector<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   in_stack_ffffffffffffffb4,(bool)grow_hint);
      }
      if ((local_1d != false) &&
         (bVar1 = send_final_block((lzcompressor *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
         !bVar1)) {
        local_1d = false;
      }
      *(undefined1 *)(in_RDI + 0x387c) = 1;
    }
    else {
      for (; local_2c != 0; local_2c = local_2c - uVar2) {
        iVar5 = *(int *)(in_RDI + 0x17a4);
        uVar6 = local_2c;
        uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x3850));
        uVar2 = local_2c;
        if (iVar5 - uVar3 <= uVar6) {
          in_stack_ffffffffffffffb0 = *(int *)(in_RDI + 0x17a4);
          uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x3850));
          uVar2 = in_stack_ffffffffffffffb0 - uVar2;
        }
        if (uVar2 == *(uint *)(in_RDI + 0x17a4)) {
          local_1d = compress_block(in_stack_00001f98,in_stack_00001f90,in_stack_00001f8c);
        }
        else {
          uVar3 = uVar2;
          bVar1 = vector<unsigned_char>::append
                            ((vector<unsigned_char> *)CONCAT44(uVar6,iVar5),
                             (uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                             (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
          if (!bVar1) {
            return false;
          }
          uVar4 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x3850));
          if (uVar4 == *(uint *)(in_RDI + 0x17a4)) {
            in_stack_ffffffffffffffa8 =
                 vector<unsigned_char>::get_ptr((vector<unsigned_char> *)(in_RDI + 0x3850));
            vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x3850));
            local_1d = compress_block(in_stack_00001f98,in_stack_00001f90,in_stack_00001f8c);
            vector<unsigned_char>::try_resize
                      ((vector<unsigned_char> *)CONCAT44(uVar6,iVar5),uVar3,
                       SUB41((uint)in_stack_ffffffffffffffb0 >> 0x18,0));
          }
        }
      }
    }
    lzham_flush_buffered_printf();
    local_1 = local_1d;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lzcompressor::put_bytes(const void* pBuf, uint buf_len)
   {
      LZHAM_ASSERT(!m_finished);
      if (m_finished)
         return false;

      bool status = true;

      if (!pBuf)
      {
         if (m_block_buf.size())
         {
            status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

            m_block_buf.try_resize(0);
         }

         if (status)
         {
            if (!send_final_block())
            {
               status = false;
            }
         }

         m_finished = true;
      }
      else
      {
         const uint8 *pSrcBuf = static_cast<const uint8*>(pBuf);
         uint num_src_bytes_remaining = buf_len;

         while (num_src_bytes_remaining)
         {
            const uint num_bytes_to_copy = LZHAM_MIN(num_src_bytes_remaining, m_params.m_block_size - m_block_buf.size());

            if (num_bytes_to_copy == m_params.m_block_size)
            {
               LZHAM_ASSERT(!m_block_buf.size());

               status = compress_block(pSrcBuf, num_bytes_to_copy);
            }
            else
            {
               if (!m_block_buf.append(static_cast<const uint8 *>(pSrcBuf), num_bytes_to_copy)) return false;

               LZHAM_ASSERT(m_block_buf.size() <= m_params.m_block_size);

               if (m_block_buf.size() == m_params.m_block_size)
               {
                  status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

                  m_block_buf.try_resize(0);
               }
            }

            pSrcBuf += num_bytes_to_copy;
            num_src_bytes_remaining -= num_bytes_to_copy;
         }
      }

      lzham_flush_buffered_printf();

      return status;
   }